

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O0

void __thiscall QHstsPolicy::QHstsPolicy(QHstsPolicy *this)

{
  QHstsPolicyPrivate *this_00;
  QHstsPolicyPrivate *in_RDI;
  
  this_00 = (QHstsPolicyPrivate *)operator_new(0x20);
  QHstsPolicyPrivate::QHstsPolicyPrivate(this_00);
  QSharedDataPointer<QHstsPolicyPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QHstsPolicyPrivate> *)this_00,in_RDI);
  return;
}

Assistant:

QHstsPolicy::QHstsPolicy() : d(new QHstsPolicyPrivate)
{
}